

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::PReLU_x86_fma::forward_inplace(PReLU_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  uint *puVar2;
  void *pvVar3;
  undefined4 *puVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int iVar9;
  float *ptr;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  undefined1 (*pauVar15) [32];
  ulong uVar16;
  undefined1 (*pauVar17) [16];
  int iVar18;
  long lVar19;
  undefined1 (*pauVar20) [32];
  uint uVar21;
  ulong uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  
  auVar5 = _DAT_005a48a0;
  auVar23 = _DAT_005a4880;
  iVar9 = bottom_top_blob->elempack;
  iVar12 = bottom_top_blob->dims;
  iVar18 = bottom_top_blob->w;
  uVar14 = bottom_top_blob->h;
  auVar27 = in_ZMM5._0_16_;
  if (iVar12 == 3) {
    uVar10 = bottom_top_blob->c;
    if (0 < (int)uVar10) {
      uVar14 = iVar18 * iVar9 * uVar14;
      uVar16 = 0;
      auVar40 = ZEXT816(0);
      auVar25._8_8_ = 0x8000000000000000;
      auVar25._0_8_ = 0x8000000000000000;
      auVar27 = vpcmpeqd_avx(auVar27,auVar27);
      auVar30._8_4_ = 0xffff;
      auVar30._0_8_ = 0xffff0000ffff;
      auVar30._12_4_ = 0xffff;
      auVar30._16_4_ = 0xffff;
      auVar30._20_4_ = 0xffff;
      auVar30._24_4_ = 0xffff;
      auVar30._28_4_ = 0xffff;
      do {
        puVar4 = (undefined4 *)(this->super_PReLU).slope_data.data;
        if ((this->super_PReLU).num_slope < 2) {
          uVar1 = *puVar4;
          auVar57._4_4_ = uVar1;
          auVar57._0_4_ = uVar1;
          auVar57._8_4_ = uVar1;
          auVar57._12_4_ = uVar1;
          auVar34 = auVar57;
LAB_003209b5:
          auVar24 = auVar34;
          auVar36._16_16_ = auVar57;
          auVar36._0_16_ = auVar57;
        }
        else {
          uVar21 = puVar4[uVar16];
          auVar24 = ZEXT416(uVar21);
          auVar34 = ZEXT416(uVar21);
          if (iVar9 == 4) {
            auVar57 = *(undefined1 (*) [16])(puVar4 + uVar16 * 4);
            goto LAB_003209b5;
          }
          auVar57 = vshufps_avx(ZEXT416(uVar21),ZEXT416(uVar21),0);
          if (iVar9 != 8) goto LAB_003209b5;
          auVar36 = *(undefined1 (*) [32])(puVar4 + uVar16 * 8);
        }
        pauVar20 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * uVar16 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar21 = 0;
        if (7 < (int)uVar14) {
          iVar12 = 7;
          do {
            auVar50 = vmaxps_avx(*pauVar20,ZEXT1632(auVar40));
            auVar6 = vminps_avx(*pauVar20,ZEXT1632(auVar40));
            auVar34 = vfmadd213ps_fma(auVar6,auVar36,auVar50);
            *pauVar20 = ZEXT1632(auVar34);
            pauVar20 = pauVar20 + 1;
            iVar12 = iVar12 + 8;
            uVar21 = uVar14 & 0xfffffff8;
          } while (iVar12 < (int)uVar14);
        }
        uVar13 = uVar21 | 3;
        while ((int)uVar13 < (int)uVar14) {
          auVar34 = vmaxps_avx(*(undefined1 (*) [16])*pauVar20,ZEXT816(0));
          auVar32 = vminps_avx(*(undefined1 (*) [16])*pauVar20,ZEXT816(0));
          auVar34 = vfmadd213ps_fma(auVar32,auVar57,auVar34);
          *(undefined1 (*) [16])*pauVar20 = auVar34;
          pauVar20 = (undefined1 (*) [32])(*pauVar20 + 0x10);
          uVar13 = uVar21 + 7;
          uVar21 = uVar21 + 4;
        }
        if ((int)uVar21 < (int)uVar14) {
          uVar11 = CONCAT44(0,~uVar21 + uVar14);
          auVar34._8_8_ = 0;
          auVar34._0_8_ = uVar11;
          auVar32 = vpshufd_avx(auVar34,0x44);
          auVar24 = vshufps_avx(auVar24,auVar24,0);
          auVar57 = vorps_avx(auVar32,auVar25);
          auVar34 = vorps_avx(auVar32,auVar25);
          uVar22 = 0;
          do {
            auVar45._8_8_ = 0;
            auVar45._0_8_ = uVar22;
            auVar45 = vpshufd_avx(auVar45,0x44);
            auVar50._16_16_ = auVar45;
            auVar50._0_16_ = auVar45;
            auVar36 = vorps_avx(auVar50,auVar23);
            auVar50 = vorps_avx(auVar50,auVar5);
            auVar45 = vorps_avx(auVar32,auVar25);
            auVar60._0_8_ = auVar50._16_8_ ^ 0x8000000000000000;
            auVar60._8_4_ = auVar50._24_4_;
            auVar60._12_4_ = auVar50._28_4_ ^ 0x80000000;
            auVar60 = vpcmpgtq_avx(auVar60,auVar45);
            auVar46._0_8_ = auVar50._0_8_ ^ 0x8000000000000000;
            auVar46._8_4_ = auVar50._8_4_;
            auVar46._12_4_ = auVar50._12_4_ ^ 0x80000000;
            auVar46 = vpcmpgtq_avx(auVar46,auVar57);
            auVar60 = vpackssdw_avx(auVar46,auVar60);
            auVar63._0_8_ = auVar36._16_8_ ^ 0x8000000000000000;
            auVar63._8_4_ = auVar36._24_4_;
            auVar63._12_4_ = auVar36._28_4_ ^ 0x80000000;
            auVar45 = vpcmpgtq_avx(auVar63,auVar45);
            auVar54._0_8_ = auVar36._0_8_ ^ 0x8000000000000000;
            auVar54._8_4_ = auVar36._8_4_;
            auVar54._12_4_ = auVar36._12_4_ ^ 0x80000000;
            auVar46 = vpcmpgtq_avx(auVar54,auVar34);
            auVar45 = vpackssdw_avx(auVar46,auVar45);
            auVar45 = vpackssdw_avx(auVar45 ^ auVar27,auVar60 ^ auVar27);
            auVar60 = vpmovsxwd_avx(auVar45);
            auVar46 = vpunpckhwd_avx(auVar45,auVar45);
            auVar59._16_16_ = auVar46;
            auVar59._0_16_ = auVar60;
            auVar50 = vmaskmovps_avx(auVar59,*(undefined1 (*) [32])(*pauVar20 + uVar22 * 4));
            auVar36 = vcmpps_avx(auVar50,ZEXT1632(auVar40),1);
            auVar36 = vandps_avx(auVar36,auVar30);
            auVar60 = vpackusdw_avx(auVar36._0_16_,auVar36._16_16_);
            auVar45 = vpand_avx(auVar45,auVar60);
            auVar60 = vpmovzxwd_avx(auVar45);
            auVar60 = vpslld_avx(auVar60,0x1f);
            auVar45 = vpunpckhwd_avx(auVar45,auVar45);
            auVar45 = vpslld_avx(auVar45,0x1f);
            auVar51._16_16_ = auVar45;
            auVar51._0_16_ = auVar60;
            auVar6._4_4_ = auVar50._4_4_ * auVar24._4_4_;
            auVar6._0_4_ = auVar50._0_4_ * auVar24._0_4_;
            auVar6._8_4_ = auVar50._8_4_ * auVar24._8_4_;
            auVar6._12_4_ = auVar50._12_4_ * auVar24._12_4_;
            auVar6._16_4_ = auVar50._16_4_ * auVar24._0_4_;
            auVar6._20_4_ = auVar50._20_4_ * auVar24._4_4_;
            auVar6._24_4_ = auVar50._24_4_ * auVar24._8_4_;
            auVar6._28_4_ = auVar50._28_4_;
            auVar36 = vmaskmovps_avx(auVar51,auVar6);
            *(undefined1 (*) [32])(*pauVar20 + uVar22 * 4) = auVar36;
            uVar22 = uVar22 + 8;
          } while ((uVar11 + 8 & 0x1fffffff8) != uVar22);
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != uVar10);
    }
  }
  else if (iVar12 == 2) {
    if (0 < (int)uVar14) {
      uVar10 = iVar18 * iVar9;
      uVar16 = 0;
      auVar40 = ZEXT816(0);
      auVar24._8_8_ = 0x8000000000000000;
      auVar24._0_8_ = 0x8000000000000000;
      auVar27 = vpcmpeqd_avx(auVar27,auVar27);
      auVar29._8_4_ = 0xffff;
      auVar29._0_8_ = 0xffff0000ffff;
      auVar29._12_4_ = 0xffff;
      auVar29._16_4_ = 0xffff;
      auVar29._20_4_ = 0xffff;
      auVar29._24_4_ = 0xffff;
      auVar29._28_4_ = 0xffff;
      do {
        puVar4 = (undefined4 *)(this->super_PReLU).slope_data.data;
        if ((this->super_PReLU).num_slope < 2) {
          uVar1 = *puVar4;
          auVar32._4_4_ = uVar1;
          auVar32._0_4_ = uVar1;
          auVar32._8_4_ = uVar1;
          auVar32._12_4_ = uVar1;
          auVar25 = auVar32;
LAB_00320773:
          auVar57 = auVar25;
          auVar35._16_16_ = auVar32;
          auVar35._0_16_ = auVar32;
        }
        else {
          uVar21 = puVar4[uVar16];
          auVar57 = ZEXT416(uVar21);
          auVar25 = ZEXT416(uVar21);
          if (iVar9 == 4) {
            auVar32 = *(undefined1 (*) [16])(puVar4 + uVar16 * 4);
            goto LAB_00320773;
          }
          auVar32 = vshufps_avx(ZEXT416(uVar21),ZEXT416(uVar21),0);
          if (iVar9 != 8) goto LAB_00320773;
          auVar35 = *(undefined1 (*) [32])(puVar4 + uVar16 * 8);
        }
        pauVar20 = (undefined1 (*) [32])
                   ((long)bottom_top_blob->w * uVar16 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar21 = 0;
        if (7 < (int)uVar10) {
          iVar12 = 7;
          do {
            auVar30 = vmaxps_avx(*pauVar20,ZEXT1632(auVar40));
            auVar36 = vminps_avx(*pauVar20,ZEXT1632(auVar40));
            auVar25 = vfmadd213ps_fma(auVar36,auVar35,auVar30);
            *pauVar20 = ZEXT1632(auVar25);
            pauVar20 = pauVar20 + 1;
            iVar12 = iVar12 + 8;
            uVar21 = uVar10 & 0xfffffff8;
          } while (iVar12 < (int)uVar10);
        }
        uVar13 = uVar21 | 3;
        while ((int)uVar13 < (int)uVar10) {
          auVar25 = vmaxps_avx(*(undefined1 (*) [16])*pauVar20,ZEXT816(0));
          auVar34 = vminps_avx(*(undefined1 (*) [16])*pauVar20,ZEXT816(0));
          auVar25 = vfmadd213ps_fma(auVar34,auVar32,auVar25);
          *(undefined1 (*) [16])*pauVar20 = auVar25;
          pauVar20 = (undefined1 (*) [32])(*pauVar20 + 0x10);
          uVar13 = uVar21 + 7;
          uVar21 = uVar21 + 4;
        }
        if ((int)uVar21 < (int)uVar10) {
          uVar11 = CONCAT44(0,~uVar21 + uVar10);
          auVar33._8_8_ = 0;
          auVar33._0_8_ = uVar11;
          auVar34 = vpshufd_avx(auVar33,0x44);
          auVar32 = vshufps_avx(auVar57,auVar57,0);
          auVar25 = vorps_avx(auVar34,auVar24);
          auVar57 = vorps_avx(auVar34,auVar24);
          uVar22 = 0;
          do {
            auVar43._8_8_ = 0;
            auVar43._0_8_ = uVar22;
            auVar45 = vpshufd_avx(auVar43,0x44);
            auVar48._16_16_ = auVar45;
            auVar48._0_16_ = auVar45;
            auVar30 = vorps_avx(auVar48,auVar23);
            auVar36 = vorps_avx(auVar48,auVar5);
            auVar45 = vorps_avx(auVar34,auVar24);
            auVar61._0_8_ = auVar36._16_8_ ^ 0x8000000000000000;
            auVar61._8_4_ = auVar36._24_4_;
            auVar61._12_4_ = auVar36._28_4_ ^ 0x80000000;
            auVar60 = vpcmpgtq_avx(auVar61,auVar45);
            auVar44._0_8_ = auVar36._0_8_ ^ 0x8000000000000000;
            auVar44._8_4_ = auVar36._8_4_;
            auVar44._12_4_ = auVar36._12_4_ ^ 0x80000000;
            auVar46 = vpcmpgtq_avx(auVar44,auVar25);
            auVar60 = vpackssdw_avx(auVar46,auVar60);
            auVar62._0_8_ = auVar30._16_8_ ^ 0x8000000000000000;
            auVar62._8_4_ = auVar30._24_4_;
            auVar62._12_4_ = auVar30._28_4_ ^ 0x80000000;
            auVar45 = vpcmpgtq_avx(auVar62,auVar45);
            auVar53._0_8_ = auVar30._0_8_ ^ 0x8000000000000000;
            auVar53._8_4_ = auVar30._8_4_;
            auVar53._12_4_ = auVar30._12_4_ ^ 0x80000000;
            auVar46 = vpcmpgtq_avx(auVar53,auVar57);
            auVar45 = vpackssdw_avx(auVar46,auVar45);
            auVar45 = vpackssdw_avx(auVar45 ^ auVar27,auVar60 ^ auVar27);
            auVar60 = vpmovsxwd_avx(auVar45);
            auVar46 = vpunpckhwd_avx(auVar45,auVar45);
            auVar58._16_16_ = auVar46;
            auVar58._0_16_ = auVar60;
            auVar36 = vmaskmovps_avx(auVar58,*(undefined1 (*) [32])(*pauVar20 + uVar22 * 4));
            auVar30 = vcmpps_avx(auVar36,ZEXT1632(auVar40),1);
            auVar30 = vandps_avx(auVar30,auVar29);
            auVar60 = vpackusdw_avx(auVar30._0_16_,auVar30._16_16_);
            auVar45 = vpand_avx(auVar45,auVar60);
            auVar60 = vpmovzxwd_avx(auVar45);
            auVar60 = vpslld_avx(auVar60,0x1f);
            auVar45 = vpunpckhwd_avx(auVar45,auVar45);
            auVar45 = vpslld_avx(auVar45,0x1f);
            auVar49._16_16_ = auVar45;
            auVar49._0_16_ = auVar60;
            auVar7._4_4_ = auVar36._4_4_ * auVar32._4_4_;
            auVar7._0_4_ = auVar36._0_4_ * auVar32._0_4_;
            auVar7._8_4_ = auVar36._8_4_ * auVar32._8_4_;
            auVar7._12_4_ = auVar36._12_4_ * auVar32._12_4_;
            auVar7._16_4_ = auVar36._16_4_ * auVar32._0_4_;
            auVar7._20_4_ = auVar36._20_4_ * auVar32._4_4_;
            auVar7._24_4_ = auVar36._24_4_ * auVar32._8_4_;
            auVar7._28_4_ = auVar36._28_4_;
            auVar30 = vmaskmovps_avx(auVar49,auVar7);
            *(undefined1 (*) [32])(*pauVar20 + uVar22 * 4) = auVar30;
            uVar22 = uVar22 + 8;
          } while ((uVar11 + 8 & 0x1fffffff8) != uVar22);
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != uVar14);
    }
  }
  else if (iVar12 == 1) {
    iVar9 = iVar9 * iVar18;
    pauVar20 = (undefined1 (*) [32])bottom_top_blob->data;
    puVar2 = (uint *)(this->super_PReLU).slope_data.data;
    if ((this->super_PReLU).num_slope < 2) {
      uVar14 = *puVar2;
      iVar12 = iVar9 + 7;
      if (-1 < iVar9) {
        iVar12 = iVar9;
      }
      uVar10 = iVar12 >> 3;
      if (7 < iVar9) {
        auVar27 = vshufps_avx(ZEXT416(uVar14),ZEXT416(uVar14),0);
        auVar23._16_16_ = auVar27;
        auVar23._0_16_ = auVar27;
        uVar16 = (ulong)uVar10;
        pauVar15 = pauVar20;
        do {
          auVar5 = vmaxps_avx(*pauVar15,ZEXT1632(ZEXT816(0) << 0x40));
          auVar30 = vminps_avx(*pauVar15,ZEXT1632(ZEXT816(0) << 0x40));
          auVar27 = vfmadd213ps_fma(auVar30,auVar23,auVar5);
          *pauVar15 = ZEXT1632(auVar27);
          pauVar15 = pauVar15 + 1;
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
      }
      iVar18 = iVar9 + uVar10 * -8;
      iVar12 = iVar18 + 3;
      if (-1 < iVar18) {
        iVar12 = iVar18;
      }
      auVar27 = ZEXT416(uVar14);
      if (3 < iVar18) {
        auVar40 = vshufps_avx(auVar27,auVar27,0);
        uVar16 = (ulong)(uint)(iVar12 >> 2);
        pauVar17 = (undefined1 (*) [16])(*pauVar20 + (long)(int)(uVar10 * 8) * 4);
        do {
          auVar25 = vmaxps_avx(*pauVar17,ZEXT816(0) << 0x40);
          auVar57 = vminps_avx(*pauVar17,ZEXT816(0) << 0x40);
          auVar25 = vfmadd213ps_fma(auVar57,auVar40,auVar25);
          *pauVar17 = auVar25;
          pauVar17 = pauVar17 + 1;
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
      }
      auVar5 = _DAT_005a48a0;
      auVar23 = _DAT_005a4880;
      iVar12 = uVar10 * 8 + (iVar12 >> 2) * 4;
      if (iVar12 < iVar9) {
        lVar19 = (long)iVar12;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = (iVar9 - lVar19) - 1;
        auVar40 = vpshufd_avx(auVar40,0x44);
        auVar25 = vshufps_avx(auVar27,auVar27,0);
        uVar11 = 0;
        uVar16 = auVar40._0_8_;
        auVar26._0_8_ = uVar16 ^ 0x8000000000000000;
        auVar26._8_4_ = auVar40._8_4_;
        uVar14 = auVar40._12_4_;
        auVar26._12_4_ = uVar14 ^ 0x80000000;
        auVar28._0_8_ = uVar16 ^ 0x8000000000000000;
        auVar28._8_4_ = auVar26._8_4_;
        auVar28._12_4_ = uVar14 ^ 0x80000000;
        auVar27 = vpcmpeqd_avx(in_ZMM6._0_16_,in_ZMM6._0_16_);
        auVar31._0_8_ = uVar16 ^ 0x8000000000000000;
        auVar31._8_4_ = auVar26._8_4_;
        auVar31._12_4_ = uVar14 ^ 0x80000000;
        auVar37._8_4_ = 0xffff;
        auVar37._0_8_ = 0xffff0000ffff;
        auVar37._12_4_ = 0xffff;
        auVar37._16_4_ = 0xffff;
        auVar37._20_4_ = 0xffff;
        auVar37._24_4_ = 0xffff;
        auVar37._28_4_ = 0xffff;
        do {
          auVar38._8_8_ = 0;
          auVar38._0_8_ = uVar11;
          auVar40 = vpshufd_avx(auVar38,0x44);
          auVar41._16_16_ = auVar40;
          auVar41._0_16_ = auVar40;
          auVar30 = vorps_avx(auVar41,auVar23);
          auVar36 = vorps_avx(auVar41,auVar5);
          auVar55._0_8_ = auVar36._16_8_ ^ 0x8000000000000000;
          auVar55._8_4_ = auVar36._24_4_;
          auVar55._12_4_ = auVar36._28_4_ ^ 0x80000000;
          auVar40 = vpcmpgtq_avx(auVar55,auVar26);
          auVar39._0_8_ = auVar36._0_8_ ^ 0x8000000000000000;
          auVar39._8_4_ = auVar36._8_4_;
          auVar39._12_4_ = auVar36._12_4_ ^ 0x80000000;
          auVar57 = vpcmpgtq_avx(auVar39,auVar28);
          auVar40 = vpackssdw_avx(auVar57,auVar40);
          auVar56._0_8_ = auVar30._16_8_ ^ 0x8000000000000000;
          auVar56._8_4_ = auVar30._24_4_;
          auVar56._12_4_ = auVar30._28_4_ ^ 0x80000000;
          auVar57 = vpcmpgtq_avx(auVar56,auVar26);
          auVar47._0_8_ = auVar30._0_8_ ^ 0x8000000000000000;
          auVar47._8_4_ = auVar30._8_4_;
          auVar47._12_4_ = auVar30._12_4_ ^ 0x80000000;
          auVar34 = vpcmpgtq_avx(auVar47,auVar31);
          auVar57 = vpackssdw_avx(auVar34,auVar57);
          auVar40 = vpackssdw_avx(auVar57 ^ auVar27,auVar40 ^ auVar27);
          auVar57 = vpmovsxwd_avx(auVar40);
          auVar34 = vpunpckhwd_avx(auVar40,auVar40);
          auVar52._16_16_ = auVar34;
          auVar52._0_16_ = auVar57;
          auVar36 = vmaskmovps_avx(auVar52,*(undefined1 (*) [32])
                                            (*pauVar20 + uVar11 * 4 + lVar19 * 4));
          auVar30 = vcmpps_avx(auVar36,ZEXT1632(ZEXT816(0) << 0x40),1);
          auVar30 = vandps_avx(auVar30,auVar37);
          auVar57 = vpackusdw_avx(auVar30._0_16_,auVar30._16_16_);
          auVar40 = vpand_avx(auVar40,auVar57);
          auVar57 = vpmovzxwd_avx(auVar40);
          auVar57 = vpslld_avx(auVar57,0x1f);
          auVar40 = vpunpckhwd_avx(auVar40,auVar40);
          auVar40 = vpslld_avx(auVar40,0x1f);
          auVar42._16_16_ = auVar40;
          auVar42._0_16_ = auVar57;
          auVar8._4_4_ = auVar36._4_4_ * auVar25._4_4_;
          auVar8._0_4_ = auVar36._0_4_ * auVar25._0_4_;
          auVar8._8_4_ = auVar36._8_4_ * auVar25._8_4_;
          auVar8._12_4_ = auVar36._12_4_ * auVar25._12_4_;
          auVar8._16_4_ = auVar36._16_4_ * auVar25._0_4_;
          auVar8._20_4_ = auVar36._20_4_ * auVar25._4_4_;
          auVar8._24_4_ = auVar36._24_4_ * auVar25._8_4_;
          auVar8._28_4_ = auVar36._28_4_;
          auVar30 = vmaskmovps_avx(auVar42,auVar8);
          *(undefined1 (*) [32])(*pauVar20 + uVar11 * 4 + lVar19 * 4) = auVar30;
          uVar11 = uVar11 + 8;
        } while (((iVar9 - lVar19) + 7U & 0xfffffffffffffff8) != uVar11);
      }
    }
    else {
      iVar12 = iVar9 + 7;
      if (-1 < iVar9) {
        iVar12 = iVar9;
      }
      uVar14 = iVar12 >> 3;
      if (7 < iVar9) {
        uVar16 = (ulong)uVar14;
        lVar19 = 0;
        do {
          auVar23 = vmaxps_avx(*(undefined1 (*) [32])(*pauVar20 + lVar19),ZEXT1632(ZEXT816(0)));
          auVar5 = vminps_avx(*(undefined1 (*) [32])(*pauVar20 + lVar19),ZEXT1632(ZEXT816(0)));
          auVar27 = vfmadd132ps_fma(auVar5,auVar23,*(undefined1 (*) [32])((long)puVar2 + lVar19));
          *(undefined1 (*) [32])(*pauVar20 + lVar19) = ZEXT1632(auVar27);
          lVar19 = lVar19 + 0x20;
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
      }
      iVar18 = iVar9 + uVar14 * -8;
      iVar12 = iVar18 + 3;
      if (-1 < iVar18) {
        iVar12 = iVar18;
      }
      if (3 < iVar18) {
        uVar16 = (ulong)(uint)(iVar12 >> 2);
        lVar19 = (long)(int)(uVar14 * 8) << 2;
        do {
          auVar27 = vmaxps_avx(*(undefined1 (*) [16])(*pauVar20 + lVar19),ZEXT816(0) << 0x40);
          auVar40 = vminps_avx(*(undefined1 (*) [16])(*pauVar20 + lVar19),ZEXT816(0) << 0x40);
          auVar27 = vfmadd132ps_fma(auVar40,auVar27,*(undefined1 (*) [16])((long)puVar2 + lVar19));
          *(undefined1 (*) [16])(*pauVar20 + lVar19) = auVar27;
          lVar19 = lVar19 + 0x10;
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
      }
      iVar12 = uVar14 * 8 + (iVar12 >> 2) * 4;
      if (iVar12 < iVar9) {
        pvVar3 = (this->super_PReLU).slope_data.data;
        lVar19 = (long)iVar12;
        do {
          if (*(float *)(*pauVar20 + lVar19 * 4) < 0.0) {
            *(float *)(*pauVar20 + lVar19 * 4) =
                 *(float *)(*pauVar20 + lVar19 * 4) * *(float *)((long)pvVar3 + lVar19 * 4);
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < iVar9);
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_loadu_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_loadu_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_loadu_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}